

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.hpp
# Opt level: O1

void remora::bindings::
     im2mat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::cpu_tag,remora::cpu_tag>>
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *images,matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
                        *output,size_t num_channels,size_t image_height,size_t image_width,
               size_t filter_height,size_t filter_width)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  size_t sVar20;
  bool bVar21;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a0;
  long local_98;
  
  lVar3 = *(long *)images;
  if (lVar3 != 0) {
    lVar1 = (image_height - filter_height) + 1;
    lVar10 = (image_width - filter_width) + 1;
    lVar14 = image_width * num_channels * 8;
    lVar2 = num_channels * 8;
    local_c0 = 0;
    lVar17 = 0;
    lVar13 = 0;
    do {
      if (lVar1 != 0) {
        local_b0 = local_c0;
        local_b8 = 0;
        lVar8 = 0;
        do {
          if (filter_height != 0) {
            local_98 = 0;
            local_a0 = local_b8;
            sVar12 = 0;
            do {
              if (lVar10 != 0) {
                lVar9 = local_b0;
                lVar15 = 0;
                lVar16 = local_a0;
                do {
                  if (filter_width != 0) {
                    sVar20 = 0;
                    lVar11 = local_98;
                    lVar19 = lVar16;
                    do {
                      if (num_channels != 0) {
                        lVar4 = *(long *)(images + 8);
                        lVar5 = *(long *)(images + 0x10);
                        lVar6 = *(long *)(output + 0x18);
                        lVar7 = *(long *)output;
                        sVar18 = 0;
                        do {
                          *(undefined8 *)(lVar6 * lVar9 + lVar11 + lVar7 + sVar18 * 8) =
                               *(undefined8 *)(lVar4 * lVar17 + lVar19 + lVar5 + sVar18 * 8);
                          sVar18 = sVar18 + 1;
                        } while (num_channels != sVar18);
                      }
                      sVar20 = sVar20 + 1;
                      lVar19 = lVar19 + lVar2;
                      lVar11 = lVar11 + lVar2;
                    } while (sVar20 != filter_width);
                  }
                  lVar16 = lVar16 + lVar2;
                  lVar9 = lVar9 + 8;
                  bVar21 = lVar15 != image_width - filter_width;
                  lVar15 = lVar15 + 1;
                } while (bVar21);
              }
              sVar12 = sVar12 + 1;
              local_a0 = local_a0 + lVar14;
              local_98 = local_98 + filter_width * num_channels * 8;
            } while (sVar12 != filter_height);
          }
          local_b8 = local_b8 + lVar14;
          local_b0 = local_b0 + lVar10 * 8;
          bVar21 = lVar8 != image_height - filter_height;
          lVar8 = lVar8 + 1;
        } while (bVar21);
      }
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + 8;
      local_c0 = local_c0 + lVar10 * lVar1 * 8;
    } while (lVar13 != lVar3);
  }
  return;
}

Assistant:

void im2mat(
	matrix_expression<E1, cpu_tag> const& images,
	matrix_expression<E2, cpu_tag>& output,
	std::size_t num_channels,
	std::size_t image_height,
	std::size_t image_width,
	std::size_t filter_height,
	std::size_t filter_width
){
	static_assert(std::is_same<typename E1::orientation, row_major>::value, "Column major not implemented");
	static_assert(std::is_same<typename E2::orientation, row_major>::value, "Column major not implemented");
	std::size_t rows_per_image = (image_height - filter_height +1) * (image_width - filter_width +1);
	//the order of loops is chosen such, that only very little changes of rows are performed
	for(std::size_t im = 0; im != images().size1(); ++im){
		for(std::size_t i = 0; i != image_height - filter_height +1; ++i){// iterate over row-positions in the image
			for(std::size_t i1 = 0; i1 != filter_height; ++i1){//iterate over the the rows of the current filter
				for(std::size_t j = 0; j != image_width - filter_width +1; ++j){//iterate over the column-position in the image
					std::size_t row_start = im * rows_per_image + i * (image_width - filter_width +1) + j;
					for(std::size_t j1 = 0; j1 != filter_width; ++j1){
						std::size_t col_start = (i1 * filter_width + j1) * num_channels;
						std::size_t image_start = ((i+i1) * image_width + j+j1) * num_channels;
						for(std::size_t c = 0; c != num_channels; ++c){//iterate over the channels
							output()(row_start, col_start + c) = images()(im,image_start + c);
						}
					}
				}
			}
		}
	}
}